

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O2

ssize_t __thiscall
nuraft::asio_rpc_client::send(asio_rpc_client *this,int __fd,void *__buf,size_t __n,int __flags)

{
  element_type *peVar1;
  pointer psVar2;
  element_type *peVar3;
  asio_service_impl *paVar4;
  pointer psVar5;
  string *psVar6;
  _Alloc_hider _Var7;
  bool bVar8;
  int iVar9;
  uint32_t uVar10;
  buffer *pbVar11;
  size_t sVar12;
  byte *pbVar13;
  ssize_t extraout_RAX;
  shared_ptr<nuraft::buffer> *it;
  long lVar14;
  pointer psVar15;
  uint uVar16;
  ptr<log_entry> *le;
  pointer psVar17;
  undefined4 in_register_00000034;
  __shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2> *p_Var18;
  char *pcVar19;
  ptr<buffer> req_buf;
  string meta_str;
  uint64_t send_timeout_ms_local;
  __shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2> *local_230;
  ptr<asio_rpc_client> self;
  vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
  log_entry_bufs;
  __shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2> local_1d0;
  undefined1 local_1c0 [16];
  buffer_serializer ss;
  _Any_data local_198;
  _Any_data local_188 [2];
  element_type *local_168;
  char *local_e8;
  bool exp;
  undefined8 local_d8;
  function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
  local_d0;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::error_code)>
  local_b0;
  _Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::shared_ptr<nuraft::buffer>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::error_code,_unsigned_long)>
  local_90;
  
  p_Var18 = (__shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2> *)
            CONCAT44(in_register_00000034,__fd);
  send_timeout_ms_local = __n;
  if (((this->abandoned_)._M_base._M_i & 1U) != 0) {
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar1 != (element_type *)0x0) && (iVar9 = (*peVar1->_vptr_logger[7])(), 1 < iVar9)) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pcVar19 = "disabled";
      if (this->ssl_enabled_ != false) {
        pcVar19 = "enabled";
      }
      msg_if_given_abi_cxx11_
                ((string *)&ss,"client %p to %s:%s is already stale (SSL %s)",this,
                 (this->host_)._M_dataplus._M_p,(this->port_)._M_dataplus._M_p,pcVar19);
      (*peVar1->_vptr_logger[8])
                (peVar1,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                 ,"send",1000,(string *)&ss);
      std::__cxx11::string::~string((string *)&ss);
    }
    meta_str._M_dataplus._M_p = (pointer)0x0;
    meta_str._M_string_length = 0;
    local_e8 = "abandoned client to %s";
    log_entry_bufs.
    super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)strfmt<200>::fmt<char_const*>((strfmt<200> *)&ss,(this->host_)._M_dataplus._M_p);
    std::make_shared<nuraft::rpc_exception,char_const*,std::shared_ptr<nuraft::req_msg>&>
              ((char **)&req_buf,(shared_ptr<nuraft::req_msg> *)&log_entry_bufs);
    std::
    function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>::
    operator()((function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                *)__buf,(shared_ptr<nuraft::resp_msg> *)&meta_str,
               (shared_ptr<nuraft::rpc_exception> *)&req_buf);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&req_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    psVar6 = &meta_str;
    goto LAB_001be9b7;
  }
  std::__shared_ptr<nuraft::asio_rpc_client,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<nuraft::asio_rpc_client,void>
            ((__shared_ptr<nuraft::asio_rpc_client,(__gnu_cxx::_Lock_policy)2> *)&self,
             (__weak_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<nuraft::asio_rpc_client>);
  if ((((this->ssl_socket_).next_layer_)->super_basic_socket<asio::ip::tcp,_asio::any_io_executor>).
      impl_.implementation_.super_base_implementation_type.socket_ == -1) {
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar1 != (element_type *)0x0) && (iVar9 = (*peVar1->_vptr_logger[7])(), 4 < iVar9)) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)&ss,"socket %p to %s:%s is not opened yet",this,
                 (this->host_)._M_dataplus._M_p,(this->port_)._M_dataplus._M_p);
      (*peVar1->_vptr_logger[8])
                (peVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                 ,"send",0x3f5,&ss);
      std::__cxx11::string::~string((string *)&ss);
    }
    _exp = (code *)((ulong)_exp & 0xffffffffffffff00);
    bVar8 = std::atomic<bool>::compare_exchange_strong
                      (&this->attempting_conn_,&exp,true,memory_order_seq_cst);
    if (!bVar8) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar1 != (element_type *)0x0) && (iVar9 = (*peVar1->_vptr_logger[7])(), 2 < iVar9)) {
        peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)&ss,
                   "cannot send req as other thread is racing on opening connection to (%s:%s), count %zu"
                   ,(this->host_)._M_dataplus._M_p,(this->port_)._M_dataplus._M_p,
                   (this->num_send_fails_).super___atomic_base<unsigned_long>._M_i);
        (*peVar1->_vptr_logger[8])
                  (peVar1,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                   ,"send",0x401,&ss);
        std::__cxx11::string::~string((string *)&ss);
      }
      LOCK();
      (this->num_send_fails_).super___atomic_base<unsigned_long>._M_i =
           (this->num_send_fails_).super___atomic_base<unsigned_long>._M_i + 1;
      UNLOCK();
      std::
      make_shared<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>,asio::io_context&>
                ((io_context *)&meta_str);
      ss.endian_ = 500000000;
      ss._4_4_ = 0;
      asio::
      basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
      ::expires_after((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                       *)meta_str._M_dataplus._M_p,(duration *)&ss);
      _Var7 = meta_str._M_dataplus;
      req_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)send_retry;
      req_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      log_entry_bufs.
      super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)this;
      std::
      _Bind<void(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client*,std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>>,std::shared_ptr<nuraft::req_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,unsigned_long,std::_Placeholder<1>))(std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>>,std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,unsigned_long,std::error_code_const&)>
      ::
      _Bind<nuraft::asio_rpc_client*,std::shared_ptr<nuraft::asio_rpc_client>&,std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>>&,std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,unsigned_long&,std::_Placeholder<1>const&>
                ((_Bind<void(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client*,std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>>,std::shared_ptr<nuraft::req_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,unsigned_long,std::_Placeholder<1>))(std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>>,std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,unsigned_long,std::error_code_const&)>
                  *)&ss,(offset_in_asio_rpc_client_to_subr *)&req_buf,
                 (asio_rpc_client **)&log_entry_bufs,&self,
                 (shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>
                  *)&meta_str,(shared_ptr<nuraft::req_msg> *)p_Var18,
                 (function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                  *)__buf,&send_timeout_ms_local,(_Placeholder<1> *)&std::placeholders::_1);
      asio::
      basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>
      ::
      async_wait<std::_Bind<void(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client*,std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>>,std::shared_ptr<nuraft::req_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,unsigned_long,std::_Placeholder<1>))(std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>>,std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,unsigned_long,std::error_code_const&)>>
                ((basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>
                  *)_Var7._M_p,
                 (_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>
                  *)&ss);
      goto LAB_001be75c;
    }
    if ((((this->ssl_socket_).next_layer_)->super_basic_socket<asio::ip::tcp,_asio::any_io_executor>
        ).impl_.implementation_.super_base_implementation_type.socket_ != -1) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar1 != (element_type *)0x0) && (iVar9 = (*peVar1->_vptr_logger[7])(), 2 < iVar9)) {
        peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)&ss,"race: socket to %s:%s is already opened, escape",
                   (this->host_)._M_dataplus._M_p,(this->port_)._M_dataplus._M_p);
        (*peVar1->_vptr_logger[8])
                  (peVar1,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                   ,"send",0x417,&ss);
        std::__cxx11::string::~string((string *)&ss);
      }
      goto LAB_001be1b8;
    }
    paVar4 = this->impl_;
    if ((paVar4->my_opt_).custom_resolver_.super__Function_base._M_manager != (_Manager_type)0x0) {
      ss._0_8_ = this;
      std::__shared_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2> *)&ss.buf_,
                 &self.super___shared_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2> *)&local_198,p_Var18);
      std::
      function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
      ::function((function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                  *)local_188,
                 (function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                  *)__buf);
      local_168 = (element_type *)send_timeout_ms_local;
      std::function<void(std::__cxx11::string_const&,std::__cxx11::string_const&,std::error_code)>::
      function<nuraft::asio_rpc_client::send(std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,unsigned_long)::_lambda(std::__cxx11::string_const&,std::__cxx11::string_const&,std::error_code)_1_,void>
                ((function<void(std::__cxx11::string_const&,std::__cxx11::string_const&,std::error_code)>
                  *)&local_b0,(anon_class_80_5_44425651 *)&ss);
      std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::error_code)>)>
      ::operator()(&(paVar4->my_opt_).custom_resolver_,&this->host_,&this->port_,&local_b0);
      std::_Function_base::~_Function_base(&local_b0.super__Function_base);
      send(std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,unsigned_long)
      ::{lambda(std::__cxx11::string_const&,std::__cxx11::string_const&,std::error_code)#1}::
      ~error_code((_lambda_std____cxx11__string_const__std____cxx11__string_const__std__error_code__1_
                   *)&ss);
      goto LAB_001be9b2;
    }
    std::__shared_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2> *)local_1c0,
               &self.super___shared_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_1d0,p_Var18)
    ;
    std::
    function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>::
    function(&local_d0,
             (function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
              *)__buf);
    execute_resolver(this,(ptr<asio_rpc_client> *)local_1c0,(ptr<req_msg> *)&local_1d0,&this->host_,
                     &this->port_,&local_d0,send_timeout_ms_local);
    std::_Function_base::~_Function_base(&local_d0.super__Function_base);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1d0._M_refcount);
    psVar6 = (string *)local_1c0;
LAB_001be76e:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&psVar6->_M_string_length);
  }
  else {
LAB_001be1b8:
    if ((this->ssl_enabled_ == true) && (((this->ssl_ready_)._M_base._M_i & 1U) == 0)) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar1 != (element_type *)0x0) && (iVar9 = (*peVar1->_vptr_logger[7])(), 2 < iVar9)) {
        peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)&ss,"cannot send req as SSL is not ready yet (%s:%s), count %zu",
                   (this->host_)._M_dataplus._M_p,(this->port_)._M_dataplus._M_p,
                   (this->num_send_fails_).super___atomic_base<unsigned_long>._M_i);
        (*peVar1->_vptr_logger[8])
                  (peVar1,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                   ,"send",0x441,&ss);
        std::__cxx11::string::~string((string *)&ss);
      }
      LOCK();
      (this->num_send_fails_).super___atomic_base<unsigned_long>._M_i =
           (this->num_send_fails_).super___atomic_base<unsigned_long>._M_i + 1;
      UNLOCK();
      std::
      make_shared<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>,asio::io_context&>
                ((io_context *)&meta_str);
      ss.endian_ = 500000000;
      ss._4_4_ = 0;
      asio::
      basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
      ::expires_after((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                       *)meta_str._M_dataplus._M_p,(duration *)&ss);
      _Var7 = meta_str._M_dataplus;
      req_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)send_retry;
      req_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      log_entry_bufs.
      super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)this;
      std::
      _Bind<void(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client*,std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>>,std::shared_ptr<nuraft::req_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,unsigned_long,std::_Placeholder<1>))(std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>>,std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,unsigned_long,std::error_code_const&)>
      ::
      _Bind<nuraft::asio_rpc_client*,std::shared_ptr<nuraft::asio_rpc_client>&,std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>>&,std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,unsigned_long&,std::_Placeholder<1>const&>
                ((_Bind<void(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client*,std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>>,std::shared_ptr<nuraft::req_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,unsigned_long,std::_Placeholder<1>))(std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>>,std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,unsigned_long,std::error_code_const&)>
                  *)&ss,(offset_in_asio_rpc_client_to_subr *)&req_buf,
                 (asio_rpc_client **)&log_entry_bufs,&self,
                 (shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>
                  *)&meta_str,(shared_ptr<nuraft::req_msg> *)p_Var18,
                 (function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                  *)__buf,&send_timeout_ms_local,(_Placeholder<1> *)&std::placeholders::_1);
      asio::
      basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>
      ::
      async_wait<std::_Bind<void(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client*,std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>>,std::shared_ptr<nuraft::req_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,unsigned_long,std::_Placeholder<1>))(std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>>,std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,unsigned_long,std::error_code_const&)>>
                ((basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>
                  *)_Var7._M_p,
                 (_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>))(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_const_std::error_code_&)>
                  *)&ss);
LAB_001be75c:
      std::
      _Tuple_impl<1UL,_std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>_>
      ::~_Tuple_impl((_Tuple_impl<1UL,_std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>_>
                      *)&ss.pos_);
      psVar6 = &meta_str;
      goto LAB_001be76e;
    }
    set_busy_flag(this,true);
    iVar9 = 0;
    LOCK();
    (this->num_send_fails_).super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    log_entry_bufs.
    super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    log_entry_bufs.
    super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    log_entry_bufs.
    super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    bVar8 = (this->impl_->my_opt_).replicate_log_timestamp_;
    uVar16 = (uint)bVar8 << 2;
    psVar2 = (p_Var18->_M_ptr->log_entries_).
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_230 = p_Var18;
    for (psVar17 = (p_Var18->_M_ptr->log_entries_).
                   super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; p_Var18 = local_230, psVar17 != psVar2
        ; psVar17 = psVar17 + 1) {
      pbVar11 = log_entry::get_buf((psVar17->
                                   super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr);
      sVar12 = buffer::size(pbVar11);
      buffer::alloc((buffer *)&meta_str,sVar12 + (ulong)bVar8 * 8 + 0xd);
      buffer_serializer::buffer_serializer(&ss,(ptr<buffer> *)&meta_str,LITTLE);
      buffer_serializer::put_u64
                (&ss,((psVar17->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr)->term_);
      buffer_serializer::put_u8
                (&ss,((psVar17->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr)->value_type_);
      if ((this->impl_->my_opt_).replicate_log_timestamp_ == true) {
        buffer_serializer::put_u64
                  (&ss,((psVar17->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)
                       ._M_ptr)->timestamp_us_);
      }
      pbVar11 = log_entry::get_buf((psVar17->
                                   super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr);
      sVar12 = buffer::size(pbVar11);
      buffer_serializer::put_i32(&ss,(int32_t)sVar12);
      pbVar11 = log_entry::get_buf((psVar17->
                                   super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr);
      pbVar13 = buffer::data_begin(pbVar11);
      pbVar11 = log_entry::get_buf((psVar17->
                                   super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr);
      sVar12 = buffer::size(pbVar11);
      buffer_serializer::put_raw(&ss,pbVar13,sVar12);
      std::
      vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>::
      push_back(&log_entry_bufs,(value_type *)&meta_str);
      sVar12 = buffer::size((buffer *)meta_str._M_dataplus._M_p);
      iVar9 = iVar9 + (int)sVar12;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&meta_str._M_string_length);
    }
    meta_str._M_dataplus._M_p = (pointer)&meta_str.field_2;
    meta_str._M_string_length = 0;
    meta_str.field_2._M_local_buf[0] = '\0';
    if ((this->impl_->my_opt_).write_req_meta_.super__Function_base._M_manager == (_Manager_type)0x0
       ) {
      lVar14 = 0;
    }
    else {
      peVar3 = local_230->_M_ptr;
      local_188[0]._0_8_ = peVar3->commit_idx_;
      ss.pos_ = (peVar3->super_msg_base).term_;
      ss.endian_ = (peVar3->super_msg_base).type_;
      ss._4_4_ = (peVar3->super_msg_base).src_;
      ss.buf_ = (buffer *)CONCAT44(ss.buf_._4_4_,(peVar3->super_msg_base).dst_);
      local_198._M_unused._0_8_ = (undefined8)peVar3->last_log_term_;
      local_198._8_8_ = peVar3->last_log_idx_;
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_nuraft::asio_service_meta_cb_params_&)>
      ::operator()((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&req_buf,
                   &(this->impl_->my_opt_).write_req_meta_,(asio_service_meta_cb_params *)&ss);
      std::__cxx11::string::operator=((string *)&meta_str,(string *)&req_buf);
      std::__cxx11::string::~string((string *)&req_buf);
      if (meta_str._M_string_length == 0) {
        lVar14 = 0;
      }
      else {
        uVar16 = uVar16 | 1;
        lVar14 = meta_str._M_string_length + 4;
      }
    }
    buffer::alloc((buffer *)&req_buf,iVar9 + lVar14 + 0x36);
    buffer::pos(req_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0);
    pbVar13 = buffer::data(req_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
    buffer::put(req_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,'\0');
    buffer::put(req_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                (char)(p_Var18->_M_ptr->super_msg_base).type_);
    buffer::put(req_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                (p_Var18->_M_ptr->super_msg_base).src_);
    buffer::put(req_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                (p_Var18->_M_ptr->super_msg_base).dst_);
    buffer::put(req_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                (p_Var18->_M_ptr->super_msg_base).term_);
    buffer::put(req_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                p_Var18->_M_ptr->last_log_term_);
    buffer::put(req_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                p_Var18->_M_ptr->last_log_idx_);
    buffer::put(req_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                p_Var18->_M_ptr->commit_idx_);
    buffer::put(req_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                iVar9 + (int)lVar14);
    uVar10 = crc32_8(pbVar13,0x2e,0);
    buffer::put(req_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                CONCAT44(uVar16,uVar10));
    psVar15 = log_entry_bufs.
              super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar5 = log_entry_bufs.
             super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((uVar16 & 1) != 0) {
      buffer::put(req_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                  (byte *)meta_str._M_dataplus._M_p,meta_str._M_string_length);
      psVar15 = log_entry_bufs.
                super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar5 = log_entry_bufs.
               super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    for (; psVar15 != psVar5; psVar15 = psVar15 + 1) {
      buffer::put(req_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                  (psVar15->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    }
    buffer::pos(req_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0);
    if (send_timeout_ms_local != 0) {
      ss._0_8_ = send_timeout_ms_local * 1000000;
      asio::
      basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
      ::expires_after(&this->operation_timer_,(duration *)&ss);
      ss._0_8_ = cancel_socket;
      ss.buf_ = (buffer *)0x0;
      ss.pos_ = (size_t)this;
      asio::
      basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>
      ::
      async_wait<std::_Bind<void(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client*,std::_Placeholder<1>))(std::error_code_const&)>>
                ((basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>
                  *)&this->operation_timer_,
                 (_Bind<void_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::_Placeholder<1>))(const_std::error_code_&)>
                  *)&ss);
    }
    bVar8 = this->ssl_enabled_;
    pbVar13 = buffer::data(req_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
    ss.buf_ = (buffer *)
              buffer::size(req_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
    _exp = sent;
    local_d8 = 0;
    ss._0_8_ = pbVar13;
    std::
    _Bind<void(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<nuraft::req_msg>,std::shared_ptr<nuraft::buffer>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>&,std::shared_ptr<nuraft::buffer>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,std::error_code,unsigned_long)>
    ::
    _Bind<std::shared_ptr<nuraft::asio_rpc_client>&,std::shared_ptr<nuraft::req_msg>&,std::shared_ptr<nuraft::buffer>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
              ((_Bind<void(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<nuraft::req_msg>,std::shared_ptr<nuraft::buffer>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>&,std::shared_ptr<nuraft::buffer>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,std::error_code,unsigned_long)>
                *)&local_90,(offset_in_asio_rpc_client_to_subr *)&exp,&self,
               (shared_ptr<nuraft::req_msg> *)local_230,&req_buf,
               (function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                *)__buf,(_Placeholder<1> *)&std::placeholders::_1,
               (_Placeholder<2> *)&std::placeholders::_2);
    aa::
    write<asio::mutable_buffers_1,std::_Bind<void(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<nuraft::req_msg>,std::shared_ptr<nuraft::buffer>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>&,std::shared_ptr<nuraft::buffer>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,std::error_code,unsigned_long)>>
              (bVar8,&this->ssl_socket_,&this->socket_,(mutable_buffers_1 *)&ss,&local_90);
    std::
    _Tuple_impl<0UL,_std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
    ::~_Tuple_impl(&local_90._M_bound_args.
                    super__Tuple_impl<0UL,_std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
                  );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&req_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::string::~string((string *)&meta_str);
    std::vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
    ::~vector(&log_entry_bufs);
  }
LAB_001be9b2:
  psVar6 = (string *)&self.super___shared_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>;
LAB_001be9b7:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&psVar6->_M_string_length);
  return extraout_RAX;
}

Assistant:

virtual void send(ptr<req_msg>& req,
                      rpc_handler& when_done,
                      uint64_t send_timeout_ms = 0) __override__
    {
        if (abandoned_) {
            p_er( "client %p to %s:%s is already stale (SSL %s)",
                  this, host_.c_str(), port_.c_str(),
                  ( ssl_enabled_ ? "enabled" : "disabled" ) );
            ptr<resp_msg> rsp;
            ptr<rpc_exception> except
               ( cs_new<rpc_exception>
                 ( lstrfmt("abandoned client to %s").fmt(host_.c_str()),
                   req ) );
            when_done(rsp, except);
            return;
        }

        ptr<asio_rpc_client> self = this->shared_from_this();
        while (!socket().is_open()) { // Dummy one-time loop
            p_db( "socket %p to %s:%s is not opened yet",
                  this, host_.c_str(), port_.c_str() );

            // WARNING:
            //   Only one thread can establish connection at a time.
            //   Since we don't re-use RPC client upon connection failure,
            //   this flag will never be cleared.
            bool exp = false;
            bool desired = true;
            if (!attempting_conn_.compare_exchange_strong(exp, desired)) {
                // Other thread is attempting connection, just wait.
                p_wn( "cannot send req as other thread is racing on opening "
                      "connection to (%s:%s), count %zu",
                      host_.c_str(), port_.c_str(), num_send_fails_.load() );
                num_send_fails_.fetch_add(1);

                ptr<asio::steady_timer> timer =
                    cs_new<asio::steady_timer>(impl_->get_io_svc());
                timer->expires_after
                       ( std::chrono::duration_cast<std::chrono::nanoseconds>
                         ( std::chrono::milliseconds( SEND_RETRY_MS ) ) );
                timer->async_wait( std::bind( &asio_rpc_client::send_retry,
                                              this,
                                              self,
                                              timer,
                                              req,
                                              when_done,
                                              send_timeout_ms,
                                              std::placeholders::_1 ) );
                return;
            }

            if (socket().is_open()) {
                // Already opened, skip async_connect.
                p_wn("race: socket to %s:%s is already opened, escape",
                     host_.c_str(), port_.c_str());
                break;
            }

            if (impl_->get_options().custom_resolver_) {
                impl_->get_options().custom_resolver_(
                    host_,
                    port_,
                    [this, self, req, when_done, send_timeout_ms]
                    ( const std::string& resolved_host,
                      const std::string& resolved_port,
                      std::error_code err ) {
                        if (!err) {
                            p_in( "custom resolver: %s:%s to %s:%s",
                                  host_.c_str(), port_.c_str(),
                                  resolved_host.c_str(), resolved_port.c_str() );
                            execute_resolver(self, req, resolved_host, resolved_port,
                                             when_done, send_timeout_ms);
                        } else {
                            ptr<resp_msg> rsp;
                            ptr<rpc_exception> except
                               ( cs_new<rpc_exception>
                                       ( lstrfmt("failed to resolve host %s by given "
                                                 "custom resolver "
                                                 "due to error %d, %s")
                                                .fmt( host_.c_str(),
                                                      err.value(),
                                                      err.message().c_str() ),
                                         req ) );
                            when_done(rsp, except);
                        }
                    } );
            } else {
                execute_resolver(self, req, host_, port_, when_done, send_timeout_ms);
            }
            return;
        }

        if (ssl_enabled_ && !ssl_ready_) {
            // TCP socket is opened, but SSL handshake is not done yet.
            // Since other thread is doing it, this thread should just wait.
            p_wn( "cannot send req as SSL is not ready yet (%s:%s), count %zu",
                  host_.c_str(), port_.c_str(), num_send_fails_.load() );
            num_send_fails_.fetch_add(1);

            ptr<asio::steady_timer> timer =
                cs_new<asio::steady_timer>(impl_->get_io_svc());
            timer->expires_after
                   ( std::chrono::duration_cast<std::chrono::nanoseconds>
                     ( std::chrono::milliseconds( SEND_RETRY_MS ) ) );
            timer->async_wait( std::bind( &asio_rpc_client::send_retry,
                                          this,
                                          self,
                                          timer,
                                          req,
                                          when_done,
                                          send_timeout_ms,
                                          std::placeholders::_1 ) );
            return;
        }

        // Socket should be idle now. If not, it should be a bug.
        set_busy_flag(true);

        // If we reach here, that means connection is valid.
        // Reset the counter.
        num_send_fails_ = 0;

        // serialize req, send and read response
        std::vector<ptr<buffer>> log_entry_bufs;
        int32 log_data_size(0);

        uint32_t flags = 0x0;
        size_t LOG_ENTRY_SIZE = 8 + 1 + 4;
        if (impl_->get_options().replicate_log_timestamp_) {
            LOG_ENTRY_SIZE += 8;
            flags |= INCLUDE_LOG_TIMESTAMP;
        }

        for (auto& entry: req->log_entries()) {
            ptr<log_entry>& le = entry;
            ptr<buffer> entry_buf = buffer::alloc
                                    ( LOG_ENTRY_SIZE + le->get_buf().size() );
#if 0
            entry_buf->put( le->get_term() );
            entry_buf->put( (byte)le->get_val_type() );
            entry_buf->put( (int32)le->get_buf().size() );
            le->get_buf().pos(0);
            entry_buf->put( le->get_buf() );
            entry_buf->pos( 0 );
#else
            buffer_serializer ss(entry_buf);
            ss.put_u64( le->get_term() );
            ss.put_u8( le->get_val_type() );
            if (impl_->get_options().replicate_log_timestamp_) {
                ss.put_u64( le->get_timestamp() );
            }
            ss.put_i32( le->get_buf().size() );
            ss.put_raw( le->get_buf().data_begin(), le->get_buf().size() );
#endif
            log_entry_bufs.push_back(entry_buf);
            log_data_size += (int32)entry_buf->size();
        }

        size_t meta_size = 0;
        std::string meta_str;
        if (impl_->get_options().write_req_meta_) {
            meta_str = impl_->get_options().write_req_meta_( req_to_params(req) );
            if (!meta_str.empty()) {
                // If callback for meta is given, set flag.
                flags |= INCLUDE_META;
                meta_size = sizeof(int32) + meta_str.size();
            }
        }

        ptr<buffer> req_buf =
            buffer::alloc(RPC_REQ_HEADER_SIZE + meta_size + log_data_size);

        req_buf->pos(0);
        byte* req_buf_data = req_buf->data();

        byte marker = 0x0;
        req_buf->put(marker);
        req_buf->put((byte)req->get_type());
        req_buf->put(req->get_src());
        req_buf->put(req->get_dst());
        req_buf->put(req->get_term());
        req_buf->put(req->get_last_log_term());
        req_buf->put(req->get_last_log_idx());
        req_buf->put(req->get_commit_idx());
        req_buf->put((int32)meta_size + log_data_size);

        // Calculate CRC32 on header-only.
        uint32_t crc_val = crc32_8( req_buf_data,
                                    RPC_REQ_HEADER_SIZE - CRC_FLAGS_LEN,
                                    0 );

        uint64_t flags_and_crc = ((uint64_t)flags << 32) | crc_val;
        req_buf->put((ulong)flags_and_crc);

        // Handling meta if the flag is set.
        if (flags & INCLUDE_META) {
            req_buf->put( (byte*)meta_str.data(), meta_str.size() );
        }

        for (auto& it: log_entry_bufs) {
            req_buf->put(*(it));
        }
        req_buf->pos(0);

        if (send_timeout_ms != 0)
        {
            operation_timer_.expires_after
                   ( std::chrono::duration_cast<std::chrono::nanoseconds>
                     ( std::chrono::milliseconds( send_timeout_ms ) ) );
            operation_timer_.async_wait( std::bind( &asio_rpc_client::cancel_socket,
                                                    this,
                                                    std::placeholders::_1 ) );
        }


        // Note: without passing `req_buf` to callback function, it will be
        //       unreachable before the write is done so that it is freed
        //       and the memory corruption will occur.
        aa::write( ssl_enabled_, ssl_socket_, socket_,
                   asio::buffer(req_buf->data(), req_buf->size()),
                   std::bind( &asio_rpc_client::sent,
                              self,
                              req,
                              req_buf,
                              when_done,
                              std::placeholders::_1,
                              std::placeholders::_2 ) );
    }